

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_isvalid.cpp
# Opt level: O0

bool __thiscall ON_Brep::IsValidLoopGeometry(ON_Brep *this,int loop_index,ON_TextLog *text_log)

{
  int iVar1;
  uint uVar2;
  ON_BrepLoop *pOVar3;
  ON_BrepLoop *loop;
  ON_TextLog *text_log_local;
  int loop_index_local;
  ON_Brep *this_local;
  
  if ((-1 < loop_index) &&
     (iVar1 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L),
     loop_index < iVar1)) {
    pOVar3 = ON_ClassArray<ON_BrepLoop>::operator[]
                       ((ON_ClassArray<ON_BrepLoop> *)&this->m_L,loop_index);
    if (pOVar3->m_loop_index != loop_index) {
      if (text_log != (ON_TextLog *)0x0) {
        ON_TextLog::Print(text_log,"brep.m_L[%d] loop is not valid.\n",(ulong)(uint)loop_index);
        ON_TextLog::PushIndent(text_log);
        ON_TextLog::Print(text_log,"loop.m_loop_index = %d (should be %d).\n",
                          (ulong)(uint)pOVar3->m_loop_index,(ulong)(uint)loop_index);
        ON_TextLog::PopIndent(text_log);
      }
      return false;
    }
    return true;
  }
  if (text_log != (ON_TextLog *)0x0) {
    uVar2 = ON_ClassArray<ON_BrepLoop>::Count((ON_ClassArray<ON_BrepLoop> *)&this->m_L);
    ON_TextLog::Print(text_log,"brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n",
                      (ulong)(uint)loop_index,(ulong)uVar2);
  }
  return false;
}

Assistant:

bool
ON_Brep::IsValidLoopGeometry( int loop_index, ON_TextLog* text_log ) const
{
  if ( loop_index < 0 || loop_index >= m_L.Count() )
  {
    if ( text_log )
      text_log->Print("brep loop_index = %d (should be >=0 and <%d=brep.m_L.Count() ).\n",
                      loop_index, m_L.Count());
    return false;
  }
  const ON_BrepLoop& loop = m_L[loop_index];
  if ( loop.m_loop_index != loop_index )
  {
    if ( text_log )
    {
      text_log->Print("brep.m_L[%d] loop is not valid.\n",loop_index);
      text_log->PushIndent();
      text_log->Print("loop.m_loop_index = %d (should be %d).\n",
                       loop.m_loop_index, loop_index );
      text_log->PopIndent();
    }
    return false;
  }
  return true;
}